

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# square.hpp
# Opt level: O3

autodiff_fvar<float,_1UL> __thiscall
anon_unknown.dwarf_9be8::func<float>::operator()(func<float> *this,float beta)

{
  autodiff_fvar<float,_1UL> aVar1;
  bool bVar2;
  bool bVar3;
  float *pfVar4;
  long lVar5;
  long lVar6;
  float *pfVar7;
  float *pfVar8;
  float fVar9;
  promote<fvar<float,_1UL>,_fvar<float,_1UL>_> retval;
  float local_48;
  float fStack_44;
  array<float,_2UL> local_40;
  float local_38 [4];
  fvar<float,_1UL> local_28;
  fvar<float,_1UL> local_20;
  array<float,_2UL> local_18;
  
  fVar9 = this->Jx_ + this->Jx_;
  local_20.v._M_elems[1] = fVar9;
  local_20.v._M_elems[0] = fVar9 * beta;
  local_38[0] = beta;
  local_18._M_elems =
       (_Type)boost::math::differentiation::autodiff_v1::detail::sinh<float,1ul>(&local_20);
  pfVar8 = local_18._M_elems;
  fVar9 = this->Jy_ + this->Jy_;
  local_28.v._M_elems[1] = fVar9;
  local_28.v._M_elems[0] = local_38[0] * fVar9;
  local_40._M_elems =
       (_Type)boost::math::differentiation::autodiff_v1::detail::sinh<float,1ul>(&local_28);
  lVar5 = -1;
  pfVar4 = &local_48;
  bVar2 = true;
  do {
    bVar3 = bVar2;
    if ((array<float,_2UL> *)(((array<float,_2UL> *)local_38)->_M_elems + lVar5) == &local_40) {
      fVar9 = 0.0;
    }
    else {
      fVar9 = 0.0;
      lVar6 = 0;
      pfVar7 = local_40._M_elems;
      do {
        fVar9 = fVar9 + *pfVar7 * *(float *)((long)pfVar8 + lVar6);
        pfVar7 = pfVar7 + 1;
        lVar6 = lVar6 + -4;
      } while (lVar5 * -4 + -8 != lVar6);
    }
    *pfVar4 = fVar9;
    pfVar8 = pfVar8 + 1;
    lVar5 = 0;
    pfVar4 = &fStack_44;
    bVar2 = false;
  } while (bVar3);
  aVar1.v._M_elems[1] = (float)((ulong)_local_48 >> 0x20);
  aVar1.v._M_elems[0] = (float)_local_48 + -1.0;
  return (autodiff_fvar<float,_1UL>)aVar1.v._M_elems;
}

Assistant:

auto operator()(T beta) const -> decltype(boost::math::differentiation::make_fvar<T, 1>(beta)) {
    using std::sinh;
    auto beta_fvar = boost::math::differentiation::make_fvar<T, 1>(beta);
    return sinh(2 * Jx_ * beta_fvar) * sinh(2 * Jy_ * beta_fvar) - 1;
  }